

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  __u32 _Var2;
  wchar_t wVar3;
  bool bVar4;
  isobusfs_srv_priv *piVar5;
  __time_t _Var6;
  sockaddr_can_conflict *psVar7;
  int iVar8;
  uint uVar9;
  wchar_t wVar10;
  isobusfs_srv_priv_conflict *priv;
  size_t sVar11;
  epoll_event *peVar12;
  isobusfs_msg *msg;
  ulong uVar13;
  int *piVar14;
  isobusfs_srv_client *piVar15;
  wchar_t *pwVar16;
  undefined8 uVar17;
  char *pcVar18;
  char **ppcVar19;
  timespec *optarg;
  char *pcVar20;
  bool bVar21;
  ulong uVar22;
  long lVar23;
  libj1939_cmn *cmn;
  uint n;
  ulong uVar24;
  _Bool *p_Var25;
  char **writeable_volumes;
  int writeable_volumes_count;
  uint32_t local_address;
  int long_index;
  timespec ts;
  uint64_t local_name;
  timespec local_1f8;
  wchar_t local_1e8;
  undefined4 local_1e4;
  isobusfs_buf_log *local_1e0;
  isobusfs_srv_volume_conflict *local_1d8;
  wchar_t *local_1d0;
  undefined4 local_1c4;
  timespec local_1c0;
  uint64_t local_1b0;
  sockaddr_can_conflict *local_1a8;
  char *local_1a0;
  sockaddr_can local_198 [15];
  
  priv = (isobusfs_srv_priv_conflict *)malloc(0x16c2c0);
  if (priv == (isobusfs_srv_priv_conflict *)0x0) {
    err(1,"can\'t allocate priv");
  }
  memset(priv,0,0x16c2c0);
  local_1a8 = &priv->addr;
  libj1939_init_sockaddr_can((sockaddr_can *)local_1a8,0x40000);
  priv->server_version = L'\x04';
  local_1c0.tv_sec = 0;
  local_1f8.tv_sec = 0;
  local_1e4 = 0;
  local_1b0 = 0;
  local_1e8 = L'\0';
  local_1c4 = 0;
  memcpy(local_198,&PTR_anon_var_dwarf_81_0010bc60,0x160);
  local_1d8 = priv->volumes;
  local_1d0 = &priv->removable_volumes_count;
  bVar21 = false;
  local_1e0 = (isobusfs_buf_log *)0x0;
  local_1f8.tv_nsec = 0;
  bVar4 = false;
LAB_001028fd:
  iVar8 = getopt_long(argc,argv,"a:d:i:l:n:r:s:v:w:h",local_198,&local_1c4);
  switch((int *)(ulong)(iVar8 - 100)) {
  case (int *)0x0:
    pcVar18 = strdup((char *)_optarg);
    priv->default_volume = pcVar18;
    goto LAB_001028fd;
  case (int *)0x1:
  case (int *)0x2:
  case (int *)0x3:
  case (int *)0x4:
  case (int *)0x6:
  case (int *)0x7:
  case (int *)0x9:
  case (int *)0xb:
  case (int *)0xc:
  case (int *)0xd:
  case (int *)0x10:
  case (int *)0x11:
    goto switchD_00102923_caseD_1;
  case (int *)0x5:
    wVar10 = if_nametoindex((char *)_optarg);
    (priv->addr).can_ifindex = wVar10;
    piVar5 = _optarg;
    local_1e0 = (isobusfs_buf_log *)CONCAT71((int7)((ulong)priv >> 8),1);
    if (wVar10 == L'\0') {
      piVar14 = __errno_location();
      iVar8 = *piVar14;
      pcVar18 = strerror(iVar8);
      isobusfs_log(1,"Interface %s not found. Error: %d (%s)\n",piVar5,iVar8,pcVar18);
      goto LAB_00102cc3;
    }
    goto LAB_001028fd;
  case (int *)0x8:
    uVar22 = strtoul((char *)_optarg,(char **)0x0,0);
    if ((int)uVar22 - 5U < 0xfffffffc) {
      isobusfs_log(1,"invalid debug level %d",uVar22 & 0xffffffff);
    }
    isobusfs_log_level_set(uVar22 & 0xffffffff);
    goto LAB_001028fd;
  case (int *)0xa:
    if (!bVar4) {
      __isoc99_sscanf(_optarg,"%lx",&local_1b0);
      priv->local_name = local_1b0;
      (priv->addr).can_addr.j1939.name = local_1b0;
      local_1f8.tv_nsec = CONCAT71((int7)(local_1b0 >> 8),1);
      goto LAB_001028fd;
    }
    break;
  case (int *)0xe:
    optarg = &local_1c0;
    pwVar16 = local_1d0;
    goto LAB_00102a8b;
  case (int *)0xf:
    uVar9 = atoi((char *)_optarg);
    if (0xff < uVar9) {
      isobusfs_log(1,"Invalid server version %d. Using default version: %d",uVar9,4);
    }
    goto LAB_001028fd;
  case (int *)0x12:
    if (priv->volume_count < L'\n') {
      local_1a0 = strdup((char *)_optarg);
      pcVar18 = strtok(local_1a0,":");
      pcVar20 = strtok((char *)0x0,":");
      if (pcVar18 == (char *)0x0 || pcVar20 == (char *)0x0) {
        isobusfs_log(1,"Error: volume or path name is missing\n");
LAB_00102b95:
        wVar10 = L'\xffffffea';
      }
      else {
        sVar11 = strnlen(pcVar18,0x100);
        if (0xfe < sVar11) {
          pcVar18 = "Error: Volume name exceeds maximum length (%d)\n";
          uVar17 = 0xfe;
LAB_00102b8e:
          isobusfs_log(1,pcVar18,uVar17);
          goto LAB_00102b95;
        }
        sVar11 = strnlen(pcVar20,0x1002);
        if (0x1000 < sVar11) {
          pcVar18 = "Error: Path name exceeds maximum length (%d)\n";
          uVar17 = 0x1000;
          goto LAB_00102b8e;
        }
        pcVar18 = strdup(pcVar18);
        local_1d8[priv->volume_count].name = pcVar18;
        pcVar18 = strdup(pcVar20);
        wVar10 = priv->volume_count;
        local_1d8[wVar10].path = pcVar18;
        priv->volume_count = wVar10 + L'\x01';
        wVar10 = L'\0';
      }
      free(local_1a0);
    }
    else {
      isobusfs_log(1,"Maximum number of volumes (%d) exceeded\n",10);
      wVar10 = L'\xffffffea';
    }
    bVar21 = true;
    goto joined_r0x00102ba9;
  case (int *)0x13:
    optarg = &local_1f8;
    pwVar16 = &local_1e8;
LAB_00102a8b:
    wVar10 = isobusfs_srv_parse_volume_ext
                       (_optarg,(char *)optarg,(char ***)pwVar16,(int *)(ulong)(iVar8 - 100));
joined_r0x00102ba9:
    if (wVar10 < L'\0') goto LAB_00102cc8;
    goto LAB_001028fd;
  default:
    if (iVar8 != 0x61) {
      if (iVar8 != -1) goto switchD_00102923_caseD_1;
      if ((!bVar4) && ((local_1f8.tv_nsec & 1U) == 0)) {
        pcVar18 = "Error: local address or local name is missing";
        goto LAB_00102cb2;
      }
      if (bVar21) {
        if (((ulong)local_1e0 & 1) == 0) {
          pcVar18 = "Error: interface is missing";
          goto LAB_00102cb2;
        }
        wVar10 = priv->volume_count;
        uVar22 = (ulong)(uint)wVar10;
        if (uVar22 == 1) {
          if (priv->default_volume != (char *)0x0) {
            pcVar18 = "Error: default volume is not needed for single volume";
            goto LAB_00102cb2;
          }
          pcVar18 = strdup(priv->volumes[0].name);
          priv->default_volume = pcVar18;
          goto LAB_00103382;
        }
        if (wVar10 != L'\0') {
          if (wVar10 < L'\x02') goto LAB_00103382;
          pcVar18 = priv->default_volume;
          if (pcVar18 == (char *)0x0) {
            pcVar18 = "Error: default volume is missing";
            goto LAB_00102cb2;
          }
          iVar8 = strcmp(pcVar18,local_1d8->name);
          if (iVar8 == 0) goto LAB_00103382;
          lVar23 = 0;
          goto LAB_00103342;
        }
      }
      pcVar18 = "Error: volume is missing";
      goto LAB_00102cb2;
    }
    if ((local_1f8.tv_nsec & 1U) == 0) {
      __isoc99_sscanf(_optarg,"%x",&local_1e4);
      (priv->addr).can_addr.j1939.addr = (__u8)local_1e4;
      bVar4 = true;
      goto LAB_001028fd;
    }
  }
  isobusfs_log(1,"Both local address and local name provided, they are mutually exclusive\n");
  goto LAB_00102cc3;
LAB_00103342:
  if ((ulong)(uint)(wVar10 + L'\xffffffff') * 0x780 + 0x780 != lVar23 + 0x780)
  goto code_r0x00103352;
  pcVar18 = "Error: default volume should be one of defined volumes";
LAB_00102cb2:
  isobusfs_log(1,pcVar18);
  goto switchD_00102923_caseD_1;
code_r0x00103352:
  iVar8 = strcmp(pcVar18,*(char **)((long)priv->volumes[1].clients + lVar23 + -0x18));
  lVar23 = lVar23 + 0x780;
  if (iVar8 == 0) goto LAB_00103382;
  goto LAB_00103342;
LAB_00103382:
  _Var6 = local_1c0.tv_sec;
  wVar3 = *local_1d0;
  if ((long)wVar3 < 1) {
LAB_001033f6:
    wVar3 = local_1e8;
    _Var6 = local_1f8.tv_sec;
    uVar24 = (ulong)local_1e8;
    if (0 < (long)uVar24) {
      if (wVar10 < L'\x01') {
        uVar13 = 0;
LAB_001036e7:
        uVar17 = *(undefined8 *)(_Var6 + uVar13 * 8);
        pcVar18 = "Error: writeable volume %s is not defined";
        goto LAB_001036f2;
      }
      uVar13 = 0;
      do {
        pcVar18 = *(char **)(_Var6 + uVar13 * 8);
        lVar23 = 0;
        while (iVar8 = strcmp(pcVar18,*(char **)((long)priv->volumes[0].clients + lVar23 + -0x18)),
              iVar8 != 0) {
          lVar23 = lVar23 + 0x780;
          if (uVar22 * 0x780 - lVar23 == 0) {
            uVar13 = uVar13 & 0xffffffff;
            goto LAB_001036e7;
          }
        }
        *(undefined1 *)((long)priv->volumes[0].clients + lVar23 + -7) = 1;
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar24);
    }
    if (L'\0' < priv->volume_count) {
      ppcVar19 = &priv->volumes[0].path;
      lVar23 = 0;
      do {
        wVar10 = isobusfs_cmn_dh_validate_dir_path(*ppcVar19,*(_Bool *)((long)ppcVar19 + 9));
        if (wVar10 < L'\0') {
          if (wVar10 == L'\xfffffff3') {
            pcVar18 = *ppcVar19;
            pcVar20 = strerror(-0xd);
            isobusfs_log(1,"Error: can\'t access path %s, error %i (%s)",pcVar18,0xfffffff3,pcVar20)
            ;
          }
          else if (wVar10 == L'\xffffffec') {
            isobusfs_log(1,"Error: path %s is not a directory",*ppcVar19);
          }
          if (*(_Bool *)(ppcVar19 + 1) != true) goto LAB_00102cc8;
        }
        lVar23 = lVar23 + 1;
        ppcVar19 = ppcVar19 + 0xf0;
      } while (lVar23 < priv->volume_count);
    }
    if ((local_1f8.tv_nsec & 1U) == 0) {
      isobusfs_log(2,
                   "local name is not set. Wont be able to generate proper manufacturer-specific directory name. Falling mack to MCMC0000"
                  );
    }
    snprintf(priv->mfs_dir,9,"MCMC%04u");
    isobusfs_log(4,"Server configuration:");
    isobusfs_log(4,"  local NAME: 0x%lx",priv->local_name);
    isobusfs_log(4,"  manufacturer-specific directory: %s",priv->mfs_dir);
    isobusfs_log(4,"Configured volumes:");
    if (L'\0' < priv->volume_count) {
      p_Var25 = &priv->volumes[0].writeable;
      lVar23 = 0;
      do {
        isobusfs_log(4,"  %s: %s",((isobusfs_srv_volume_conflict *)(p_Var25 + -0x11))->name);
        pcVar18 = "read-only";
        if (*p_Var25 != false) {
          pcVar18 = "writeable";
        }
        isobusfs_log(4,"    %s",pcVar18);
        pcVar18 = "non-removable";
        if (p_Var25[-1] != false) {
          pcVar18 = "removable";
        }
        isobusfs_log(4,"    %s",pcVar18);
        lVar23 = lVar23 + 1;
        p_Var25 = p_Var25 + 0x780;
      } while (lVar23 < priv->volume_count);
    }
    _Var6 = local_1c0.tv_sec;
    pwVar16 = local_1d0;
    if (L'\0' < *local_1d0) {
      lVar23 = 0;
      do {
        free(*(void **)(_Var6 + lVar23 * 8));
        lVar23 = lVar23 + 1;
      } while (lVar23 < *pwVar16);
    }
    free((void *)local_1c0.tv_sec);
    _Var6 = local_1f8.tv_sec;
    if (L'\0' < wVar3) {
      uVar22 = 0;
      do {
        free(*(void **)(_Var6 + uVar22 * 8));
        uVar22 = uVar22 + 1;
      } while (uVar24 != uVar22);
    }
    free((void *)local_1f8.tv_sec);
    wVar10 = L'\0';
  }
  else {
    if (L'\0' < wVar10) {
      uVar24 = 0;
      do {
        pcVar18 = *(char **)(_Var6 + uVar24 * 8);
        lVar23 = 0;
        while (iVar8 = strcmp(pcVar18,*(char **)((long)priv->volumes[0].clients + lVar23 + -0x18)),
              iVar8 != 0) {
          lVar23 = lVar23 + 0x780;
          if (uVar22 * 0x780 - lVar23 == 0) {
            uVar24 = uVar24 & 0xffffffff;
            goto LAB_001036bb;
          }
        }
        *(undefined1 *)((long)priv->volumes[0].clients + lVar23 + -8) = 1;
        uVar24 = uVar24 + 1;
      } while (uVar24 != (long)wVar3);
      goto LAB_001033f6;
    }
    uVar24 = 0;
LAB_001036bb:
    uVar17 = *(undefined8 *)(_Var6 + uVar24 * 8);
    pcVar18 = "Error: removable volume %s is not defined";
LAB_001036f2:
    isobusfs_log(1,pcVar18,uVar17);
switchD_00102923_caseD_1:
    isobusfs_srv_print_help();
LAB_00102cc3:
    wVar10 = L'\xffffffea';
  }
LAB_00102cc8:
  if (wVar10 == L'\0') {
    wVar10 = libj1939_create_epoll();
    if (L'\xffffffff' < wVar10) {
      (priv->cmn).epoll_fd = wVar10;
      peVar12 = (epoll_event *)calloc(0x100,0xc);
      psVar7 = local_1a8;
      (priv->cmn).epoll_events = peVar12;
      if (peVar12 == (epoll_event *)0x0) {
        wVar10 = L'\xfffffff4';
      }
      else {
        (priv->cmn).epoll_events_size = 0x100;
        local_198[0].can_addr._8_8_ = *(long *)((long)&local_1a8->can_addr + 8);
        local_198[0].can_family = local_1a8->can_family;
        local_198[0]._2_2_ = *(undefined2 *)&local_1a8->field_0x2;
        local_198[0].can_ifindex = local_1a8->can_ifindex;
        local_198[0].can_addr._0_8_ = (local_1a8->can_addr).tp;
        wVar10 = libj1939_open_socket();
        if (L'\xffffffff' < wVar10) {
          priv->sock_fss = wVar10;
          wVar10 = isobusfs_cmn_configure_error_queue(wVar10);
          if (L'\xffffffff' < wVar10) {
            local_198[0].can_addr._8_4_ = 0xaa00;
            wVar10 = libj1939_bind_socket(priv->sock_fss,local_198);
            if ((((L'\xffffffff' < wVar10) &&
                 (wVar10 = libj1939_set_broadcast(priv->sock_fss), L'\xffffffff' < wVar10)) &&
                (wVar10 = isobusfs_cmn_set_linger(priv->sock_fss), L'\xffffffff' < wVar10)) &&
               (wVar10 = libj1939_socket_prio(priv->sock_fss,5), L'\xffffffff' < wVar10)) {
              local_198[0].can_addr._0_4_ = 0;
              local_198[0].can_addr._4_4_ = 0;
              local_198[0].can_addr._8_5_ = 0xff00000000;
              local_198[0].can_addr._8_4_ = 0xab00;
              wVar10 = isobusfs_cmn_connect_socket(priv->sock_fss);
              if (L'\xffffffff' < wVar10) {
                wVar10 = libj1939_add_socket_to_epoll((priv->cmn).epoll_fd,priv->sock_fss,8);
              }
            }
          }
        }
        if (L'\xffffffff' < wVar10) {
          local_198[0].can_addr._8_8_ = *(long *)((long)&psVar7->can_addr + 8);
          local_198[0].can_family = psVar7->can_family;
          local_198[0]._2_2_ = *(undefined2 *)&psVar7->field_0x2;
          local_198[0].can_ifindex = psVar7->can_ifindex;
          local_198[0].can_addr._0_8_ = (psVar7->can_addr).tp;
          wVar10 = libj1939_open_socket();
          if (L'\xffffffff' < wVar10) {
            priv->sock_in = wVar10;
            local_198[0].can_addr._8_4_ = 0xaa00;
            wVar10 = libj1939_bind_socket(wVar10,local_198);
            if (L'\xffffffff' < wVar10) {
              wVar10 = libj1939_add_socket_to_epoll((priv->cmn).epoll_fd,priv->sock_in,1);
            }
          }
          if (L'\xffffffff' < wVar10) {
            local_198[0].can_addr._8_8_ = *(long *)((long)&psVar7->can_addr + 8);
            local_198[0].can_family = psVar7->can_family;
            local_198[0]._2_2_ = *(undefined2 *)&psVar7->field_0x2;
            local_198[0].can_ifindex = psVar7->can_ifindex;
            local_198[0].can_addr._0_8_ = (psVar7->can_addr).tp;
            wVar10 = libj1939_open_socket();
            if (L'\xffffffff' < wVar10) {
              priv->sock_nack = wVar10;
              local_198[0].can_addr._8_4_ = 0xe800;
              wVar10 = libj1939_bind_socket(wVar10,local_198);
              if ((L'\xffffffff' < wVar10) &&
                 (wVar10 = libj1939_socket_prio(priv->sock_nack,6), L'\xffffffff' < wVar10)) {
                wVar10 = libj1939_add_socket_to_epoll((priv->cmn).epoll_fd,priv->sock_nack,1);
              }
            }
          }
        }
      }
    }
    if (wVar10 == L'\0') {
      isobusfs_srv_fss_init((isobusfs_srv_priv *)priv);
      isobusfs_srv_init_clients((isobusfs_srv_priv *)priv);
      clock_gettime(1,&local_1c0);
      cmn = (libj1939_cmn *)&priv->cmn;
      *(undefined4 *)&(priv->cmn).next_send_time.tv_sec = (undefined4)local_1c0.tv_sec;
      *(undefined4 *)((long)&(priv->cmn).next_send_time.tv_sec + 4) = local_1c0.tv_sec._4_4_;
      *(undefined4 *)&(priv->cmn).next_send_time.tv_nsec = (undefined4)local_1c0.tv_nsec;
      *(undefined4 *)((long)&(priv->cmn).next_send_time.tv_nsec + 4) = local_1c0.tv_nsec._4_4_;
      isobusfs_log(3,"Starting isobusfs-srv");
      local_1e0 = &priv->tx_buf_log;
      local_1f8.tv_nsec = (long)cmn;
      do {
        wVar10 = libj1939_prepare_for_events(cmn,(int *)&local_1f8,false);
        if (wVar10 == L'\0') {
          uVar22 = (ulong)(int)local_1f8.tv_sec;
          if (0 < (long)uVar22) {
            lVar23 = 4;
            uVar24 = 0;
            do {
              if ((priv->cmn).epoll_events_size <= uVar24) break;
              peVar12 = (priv->cmn).epoll_events;
              uVar9 = *(uint *)((long)peVar12 + lVar23 + -4);
              if (uVar9 == 0) {
                warn("no events");
              }
              else {
                if (((uVar9 & 8) != 0) &&
                   (*(wchar_t *)((long)&peVar12->events + lVar23) == priv->sock_fss)) {
                  local_198[0].can_family = 0;
                  local_198[0]._2_2_ = 0;
                  local_198[0].can_ifindex = 0;
                  local_198[0].can_addr._0_4_ = 0;
                  local_198[0].can_addr._4_4_ = 0;
                  local_198[0].can_addr._8_8_ = &priv->st_msg_stats;
                  iVar8 = isobusfs_recv_err(priv->sock_fss,local_198);
                  if (iVar8 != 0) {
                    isobusfs_log(2,"error queue reported error: %i",iVar8);
                  }
                }
                if ((*(byte *)((long)peVar12 + lVar23 + -4) & 1) != 0) {
                  iVar8 = *(int *)((long)&peVar12->events + lVar23);
                  msg = (isobusfs_msg *)malloc(0x10030);
                  if (msg == (isobusfs_msg *)0x0) {
                    isobusfs_log(1,"can\'t allocate rx msg struct");
                  }
                  else {
                    msg->buf_size = 0x10000;
                    msg->peer_addr_len = 0x18;
                    msg->sock = iVar8;
                    uVar13 = recvfrom(iVar8,msg,0x10000,0,(sockaddr *)&msg->peername,
                                      &msg->peer_addr_len);
                    uVar9 = (uint)uVar13;
                    if ((int)uVar9 < 0) {
                      piVar14 = __errno_location();
                      iVar8 = *piVar14;
                      strerror(iVar8);
                      isobusfs_log(1,"recvfrom(): %i (%s)",iVar8);
                    }
                    else if ((int)uVar9 < 8) {
                      isobusfs_log(2,"buf is less then min transfer: %i < %i. Dropping.",
                                   uVar13 & 0xffffffff);
                      isobusfs_send_nack(priv->sock_nack,msg);
                    }
                    else {
                      msg->len = (ulong)(uVar9 & 0x7fffffff);
                      _Var2 = (msg->peername).can_addr.j1939.pgn;
                      if (_Var2 == 0xe800) {
                        if (msg->buf[0] == '\x01') {
                          wVar10 = L'\0';
                          isobusfs_log(4,"< rx: NACK!!!!!");
                          isobusfs_dump_tx_data(local_1e0);
                        }
                        else {
                          if (msg->buf[0] != '\0') {
                            pcVar20 = "%s: unsupported ACK control: %i";
                            pcVar18 = "isobusfs_srv_rx_ack";
                            goto LAB_001031c7;
                          }
                          wVar10 = L'\0';
                          isobusfs_log(4,"< rx: ACK?????");
                        }
                      }
                      else if (_Var2 == 0xaa00) {
                        bVar1 = msg->buf[0];
                        if (bVar1 < 0x50) {
                          piVar15 = isobusfs_srv_get_client
                                              ((isobusfs_srv_priv *)priv,
                                               (msg->peername).can_addr.j1939.addr);
                          if (piVar15 == (isobusfs_srv_client *)0x0) {
                            isobusfs_log(2,"%s: client not found","isobusfs_srv_rx_fs");
                            wVar10 = L'\xffffffea';
                          }
                          else {
                            msg->sock = piVar15->sock;
                            switch(bVar1 >> 4) {
                            case 0:
                              wVar10 = isobusfs_srv_rx_cg_cm((isobusfs_srv_priv *)priv,msg);
                              break;
                            case 1:
                              wVar10 = isobusfs_srv_rx_cg_dh(priv,msg);
                              break;
                            case 2:
                              wVar10 = isobusfs_srv_rx_cg_fa((isobusfs_srv_priv *)priv,msg);
                              break;
                            case 3:
                              wVar10 = isobusfs_srv_rx_cg_fh((isobusfs_srv_priv *)priv,msg);
                              break;
                            case 4:
                              wVar10 = isobusfs_srv_rx_cg_vh((isobusfs_srv_priv *)priv,msg);
                              break;
                            default:
                              wVar10 = L'\0';
                            }
                          }
                        }
                        else {
                          wVar10 = L'\0';
                          isobusfs_log(2,"%s: unsupported command group (%i)","isobusfs_srv_rx_fs");
                          isobusfs_send_nack(priv->sock_nack,msg);
                        }
                      }
                      else {
                        pcVar20 = "%s: unsupported PGN: %i";
                        pcVar18 = "isobusfs_srv_rx_buf";
LAB_001031c7:
                        isobusfs_log(2,pcVar20,pcVar18);
                        wVar10 = L'\xffffffea';
                      }
                      if (wVar10 < L'\0') {
                        isobusfs_log(1,"unhandled error by rx buf: %i",wVar10);
                      }
                    }
                    free(msg);
                  }
                }
              }
              uVar24 = uVar24 + 1;
              lVar23 = lVar23 + 0xc;
            } while (uVar22 != uVar24);
          }
          isobusfs_srv_remove_timeouted_clients((isobusfs_srv_priv *)priv);
          wVar10 = isobusfs_srv_fss_send((isobusfs_srv_priv *)priv);
          cmn = (libj1939_cmn *)local_1f8.tv_nsec;
        }
      } while (wVar10 == L'\0');
      close((priv->cmn).epoll_fd);
      free((priv->cmn).epoll_events);
      close(priv->sock_fss);
      close(priv->sock_in);
      close(priv->sock_nack);
    }
  }
  return wVar10;
}

Assistant:

int main(int argc, char *argv[])
{
	struct isobusfs_srv_priv *priv;
	struct timespec ts;
	int ret;

	/* Allocate memory for the private structure */
	priv = malloc(sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	/* Clear memory for the private structure */
	memset(priv, 0, sizeof(*priv));

	/* Initialize sockaddr_can with a non-configurable PGN */
	libj1939_init_sockaddr_can(&priv->addr, J1939_NO_PGN);

	priv->server_version = ISOBUSFS_SRV_VERSION;
	/* Parse command line arguments */
	ret = isobusfs_srv_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	/* Prepare sockets for the server */
	ret = isobusfs_srv_sock_prepare(priv);
	if (ret)
		return ret;

	/* Initialize File Server Status structure */
	isobusfs_srv_fss_init(priv);
	/* Initialize client structures */
	isobusfs_srv_init_clients(priv);

	/* Init next st_next_send_time value to avoid warnings */
	clock_gettime(CLOCK_MONOTONIC, &ts);
	priv->cmn.next_send_time = ts;

	/* Start the isobusfsd server */
	pr_info("Starting isobusfs-srv");
	while (1) {
		ret = isobusfs_srv_process_events_and_tasks(priv);
		if (ret)
			break;
	}

	/* Close epoll and control sockets */
	close(priv->cmn.epoll_fd);
	free(priv->cmn.epoll_events);
	close(priv->sock_fss);
	close(priv->sock_in);
	close(priv->sock_nack);

	return ret;
}